

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

TSentences * __thiscall
NJamSpell::TTokenizer::Process
          (TSentences *__return_storage_ptr__,TTokenizer *this,wstring *originalText)

{
  ulong uVar1;
  const_iterator cVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  value_type local_68;
  undefined1 auStack_58 [8];
  TWords currSentence;
  wchar_t local_34 [2];
  wchar_t letter;
  
  uVar1 = originalText->_M_string_length;
  if (uVar1 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.Ptr = (wchar_t *)0x0;
    local_68.Len = 0;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      local_34[0] = std::tolower<wchar_t>
                              (*(wchar_t *)((long)(originalText->_M_dataplus)._M_p + lVar3),
                               &this->Locale);
      cVar2 = std::
              _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->Alphabet)._M_h,local_34);
      if (cVar2.super__Node_iterator_base<wchar_t,_false>._M_cur == (__node_type *)0x0) {
        if (local_68.Ptr != (wchar_t *)0x0) {
          std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                    ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_58,
                     &local_68);
          local_68.Ptr = (wchar_t *)0x0;
          local_68.Len = 0;
        }
      }
      else {
        if (local_68.Ptr == (wchar_t *)0x0) {
          local_68.Ptr = (wchar_t *)((long)(originalText->_M_dataplus)._M_p + lVar3);
        }
        local_68.Len = local_68.Len + 1;
      }
      if ((((ulong)(uint)local_34[0] < 0x40) &&
          ((0x8000400200000000U >> ((ulong)(uint)local_34[0] & 0x3f) & 1) != 0)) &&
         (auStack_58 !=
          (undefined1  [8])
          currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)auStack_58);
        if ((undefined1  [8])
            currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
            _M_impl.super__Vector_impl_data._M_start != auStack_58) {
          currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
        }
      }
      uVar1 = originalText->_M_string_length;
      lVar3 = lVar3 + 4;
    }
    if (local_68.Ptr != (wchar_t *)0x0) {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_58,&local_68
                );
    }
    if (auStack_58 !=
        (undefined1  [8])
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)auStack_58);
    }
    std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
              ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

TSentences TTokenizer::Process(const std::wstring& originalText) const {
    if (originalText.empty()) {
        return TSentences();
    }

    TSentences sentences;

    TWords currSentence;
    TWord currWord;

    for (size_t i = 0; i < originalText.size(); ++i) {
        wchar_t letter = std::tolower(originalText[i], Locale);
        if (Alphabet.find(letter) != Alphabet.end()) {
            if (currWord.Ptr == nullptr) {
                currWord.Ptr = &originalText[i];
            }
            currWord.Len += 1;
        } else {
            if (currWord.Ptr != nullptr) {
                currSentence.push_back(currWord);
                currWord = TWord();
            }
        }
        if (letter == L'?' || letter == L'!' || letter == L'.') {
            if (!currSentence.empty()) {
                sentences.push_back(currSentence);
                currSentence.clear();
            }
        }
    }
    if (currWord.Ptr != nullptr) {
        currSentence.push_back(currWord);
    }
    if (!currSentence.empty()) {
        sentences.push_back(currSentence);
    }

    return sentences;
}